

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O2

bool __thiscall
TypeEnum::getMatches
          (TypeEnum *this,uintb val,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *valnames)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  int iVar3;
  const_iterator cVar4;
  int4 i;
  ulong uVar5;
  ulong uVar6;
  uintb val_local;
  ulong local_40;
  uintb maskedval;
  
  p_Var1 = &(this->namemap)._M_t._M_impl.super__Rb_tree_header;
  uVar5 = 0;
  val_local = val;
  while( true ) {
    if ((int)uVar5 == 2) {
      return false;
    }
    if (val_local != 0) break;
    cVar4 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->namemap)._M_t,&val_local);
    if ((_Rb_tree_header *)cVar4._M_node != p_Var1) {
      local_40 = uVar5;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(valnames,(value_type *)&cVar4._M_node[1]._M_parent);
LAB_002ab551:
      return (int)local_40 == 1;
    }
LAB_002ab50c:
    iVar3 = (this->super_TypeBase).super_Datatype.size;
    if (7 < iVar3) {
      iVar3 = 8;
    }
    val_local = val_local ^ uintbmasks[iVar3];
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(valnames);
    uVar5 = (ulong)((int)uVar5 + 1);
  }
  uVar6 = 0;
  local_40 = uVar5;
  do {
    puVar2 = (this->masklist).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->masklist).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2 >> 3) <= uVar6)
    goto LAB_002ab551;
    maskedval = puVar2[uVar6] & val_local;
    if (maskedval != 0) {
      cVar4 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(this->namemap)._M_t,&maskedval);
      uVar5 = local_40;
      if ((_Rb_tree_header *)cVar4._M_node == p_Var1) goto LAB_002ab50c;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(valnames,(value_type *)&cVar4._M_node[1]._M_parent);
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

bool TypeEnum::getMatches(uintb val,vector<string> &valnames) const

{
  map<uintb,string>::const_iterator iter;
  int4 count;

  for(count=0;count<2;++count) {
    bool allmatch = true;
    if (val == 0) {	// Zero handled specially, it crosses all masks
      iter = namemap.find(val);
      if (iter != namemap.end())
	valnames.push_back( (*iter).second );
      else
	allmatch = false;
    }
    else {
      for(int4 i=0;i<masklist.size();++i) {
	uintb maskedval = val & masklist[i];
	if (maskedval == 0)	// No component of -val- in this mask
	  continue;		// print nothing
	iter = namemap.find(maskedval);
	if (iter != namemap.end())
	  valnames.push_back( (*iter).second );	// Found name for this component
	else {					// If no name for this component
	  allmatch = false;			// Give up on representation
	  break;				// Stop searching for other components
	}
      }
    }
    if (allmatch)			// If we have a complete representation
      return (count==1);		// Return whether we represented original value or complement
    val = val ^ calc_mask(size);	// Switch value we are trying to represent (to complement)
    valnames.clear();			// Clear out old attempt
  }
  return false;	// If we reach here, no representation was possible, -valnames- is empty
}